

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_utilities.hpp
# Opt level: O2

size_t jsoncons::jsonpath::escape_string<char,std::__cxx11::string>
                 (char *s,size_t length,
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sink)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  
  sVar3 = 0;
  sVar2 = 0;
  do {
    if (length == sVar3) {
      return sVar2;
    }
    cVar1 = s[sVar3];
    lVar4 = 1;
    switch(cVar1) {
    case '\b':
      break;
    case '\t':
      break;
    case '\n':
      break;
    case '\v':
      goto switchD_002f8e49_caseD_b;
    case '\f':
      break;
    case '\r':
      break;
    default:
      if ((cVar1 == '\'') || (lVar4 = 1, cVar1 == '\\')) break;
      goto switchD_002f8e49_caseD_b;
    }
    std::__cxx11::string::push_back((char)sink);
    lVar4 = 2;
switchD_002f8e49_caseD_b:
    std::__cxx11::string::push_back((char)sink);
    sVar2 = sVar2 + lVar4;
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

std::size_t escape_string(const CharT* s, std::size_t length, Sink& sink)
    {
        std::size_t count = 0;
        const CharT* begin = s;
        const CharT* end = s + length;
        for (const CharT* it = begin; it != end; ++it)
        {
            CharT c = *it;
            switch (c)
            {
                case '\\':
                    sink.push_back('\\');
                    sink.push_back('\\');
                    count += 2;
                    break;
                case '\'':
                    sink.push_back('\\');
                    sink.push_back('\'');
                    count += 2;
                    break;
                case '\b':
                    sink.push_back('\\');
                    sink.push_back('b');
                    count += 2;
                    break;
                case '\f':
                    sink.push_back('\\');
                    sink.push_back('f');
                    count += 2;
                    break;
                case '\n':
                    sink.push_back('\\');
                    sink.push_back('n');
                    count += 2;
                    break;
                case '\r':
                    sink.push_back('\\');
                    sink.push_back('r');
                    count += 2;
                    break;
                case '\t':
                    sink.push_back('\\');
                    sink.push_back('t');
                    count += 2;
                    break;
                default:
                    sink.push_back(c);
                    ++count;
                    break;
            }
        }
        return count;
    }